

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O1

pool_ptr<soul::AST::Function> __thiscall
soul::ResolutionPass::GenericFunctionResolver::getOrCreateSpecialisedFunction
          (GenericFunctionResolver *this,CallOrCast *call,Function *genericFunction,
          ArrayView<soul::Type> callerArgumentTypes,bool shouldIgnoreErrors)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  char *pcVar1;
  size_t sVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  Function *pFVar5;
  long *plVar6;
  Identifier IVar7;
  Function *function;
  long *plVar8;
  TypeArray *types;
  undefined7 in_register_00000089;
  undefined1 auVar9 [16];
  string_view newString;
  ArrayView<soul::Type> callerArgumentTypes_00;
  bool in_stack_00000008;
  string callerSignatureID;
  TypeArray resolvedTypes;
  long *local_190;
  long local_180;
  long lStack_178;
  Type *local_170;
  string local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  string local_128;
  undefined1 local_108 [216];
  
  local_170 = (Type *)CONCAT71(in_register_00000089,shouldIgnoreErrors);
  function = (Function *)callerArgumentTypes.s;
  iVar4 = (*(function->super_ASTObject)._vptr_ASTObject[3])(function);
  plVar6 = (long *)CONCAT44(extraout_var,iVar4);
  if (plVar6 == (long *)0x0) {
    throwInternalCompilerError("parentScope != nullptr","getOrCreateSpecialisedFunction",0xaa1);
  }
  local_108._0_8_ = local_108 + 0x18;
  local_108._8_8_ = 0;
  local_108._16_8_ = 8;
  callerArgumentTypes_00.e = local_170;
  callerArgumentTypes_00.s = callerArgumentTypes.e;
  bVar3 = findGenericFunctionTypes
                    ((GenericFunctionResolver *)call,(CallOrCast *)genericFunction,function,
                     callerArgumentTypes_00,(TypeArray *)local_108,in_stack_00000008);
  if (bVar3) {
    ASTUtilities::getTypeArraySignature_abi_cxx11_(&local_168,(ASTUtilities *)local_108,types);
    auVar9 = (**(code **)(*plVar6 + 0x68))(plVar6);
    for (plVar6 = auVar9._0_8_; plVar6 != auVar9._8_8_; plVar6 = plVar6 + 1) {
      pFVar5 = *(Function **)(*plVar6 + 0xa0);
      if (pFVar5 == function) {
        getIDStringForFunction_abi_cxx11_
                  (&local_128,(GenericFunctionResolver *)call,(Function *)*plVar6);
        if (local_128._M_string_length != local_168._M_string_length) goto LAB_00224bbc;
        if (local_128._M_string_length == 0) {
          bVar3 = true;
        }
        else {
          iVar4 = bcmp(local_128._M_dataplus._M_p,local_168._M_dataplus._M_p,
                       local_128._M_string_length);
          bVar3 = iVar4 == 0;
        }
      }
      else {
LAB_00224bbc:
        bVar3 = false;
      }
      if ((pFVar5 == function) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != &local_128.field_2)) {
        operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
      }
      if (bVar3) {
        pFVar5 = (Function *)*plVar6;
        goto LAB_00224d0c;
      }
    }
    pFVar5 = StructuralParser::cloneFunction
                       ((Allocator *)
                        (call->super_CallOrCastBase).super_Expression.super_Statement.
                        super_ASTObject.context.location.location.data,function);
    __rhs = (function->name).name;
    if (__rhs == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      throwInternalCompilerError("isValid()","toString",0x23);
    }
    pcVar1 = (call->super_CallOrCastBase).super_Expression.super_Statement.super_ASTObject.context.
             location.location.data;
    std::operator+(&local_148,"_",__rhs);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_148);
    plVar8 = plVar6 + 2;
    if ((long *)*plVar6 == plVar8) {
      local_180 = *plVar8;
      lStack_178 = plVar6[3];
      local_190 = &local_180;
    }
    else {
      local_180 = *plVar8;
      local_190 = (long *)*plVar6;
    }
    sVar2 = plVar6[1];
    *plVar6 = (long)plVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    newString._M_str = (char *)local_190;
    newString._M_len = sVar2;
    IVar7 = Identifier::Pool::get((Pool *)(pcVar1 + 0x20),newString);
    (pFVar5->name).name = IVar7.name;
    if (local_190 != &local_180) {
      operator_delete(local_190,local_180 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) {
      operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
    }
    (pFVar5->originalGenericFunction).object = function;
    applyGenericFunctionTypes((GenericFunctionResolver *)call,pFVar5,(TypeArray *)local_108);
LAB_00224d0c:
    (this->super_FunctionResolver).super_ErrorIgnoringRewritingASTVisitor.super_RewritingASTVisitor.
    _vptr_RewritingASTVisitor = (_func_int **)pFVar5;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_dataplus._M_p != &local_168.field_2) {
      operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    (this->super_FunctionResolver).super_ErrorIgnoringRewritingASTVisitor.super_RewritingASTVisitor.
    _vptr_RewritingASTVisitor = (_func_int **)0x0;
  }
  ArrayWithPreallocation<soul::Type,_8UL>::clear
            ((ArrayWithPreallocation<soul::Type,_8UL> *)local_108);
  return (pool_ptr<soul::AST::Function>)(Function *)this;
}

Assistant:

pool_ptr<AST::Function> getOrCreateSpecialisedFunction (AST::CallOrCast& call,
                                                                AST::Function& genericFunction,
                                                                ArrayView<Type> callerArgumentTypes,
                                                                bool shouldIgnoreErrors)
        {
            auto parentScope = genericFunction.getParentScope();
            SOUL_ASSERT (parentScope != nullptr);

            AST::TypeArray resolvedTypes;

            if (findGenericFunctionTypes (call, genericFunction, callerArgumentTypes, resolvedTypes, shouldIgnoreErrors))
            {
                auto callerSignatureID = ASTUtilities::getTypeArraySignature (resolvedTypes);

                for (auto& f : parentScope->getFunctions())
                    if (f->originalGenericFunction == genericFunction && getIDStringForFunction (f) == callerSignatureID)
                        return f;

                auto& newFunction = StructuralParser::cloneFunction (allocator, genericFunction);
                newFunction.name = allocator.get ("_" + genericFunction.name.toString() + heart::getGenericSpecialisationNameTag());
                newFunction.originalGenericFunction = genericFunction;
                applyGenericFunctionTypes (newFunction, resolvedTypes);

                return newFunction;
            }

            return {};
        }